

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_base.c
# Opt level: O0

int ffh_pairs(lua_State *L,MMS mm)

{
  TValue *L_00;
  cTValue *pcVar1;
  int in_ESI;
  long in_RDI;
  cTValue *mo;
  TValue *o;
  undefined8 in_stack_ffffffffffffff78;
  lua_State *in_stack_ffffffffffffff80;
  MMS in_stack_ffffffffffffff9c;
  int iVar2;
  cTValue *in_stack_ffffffffffffffa0;
  lua_State *in_stack_ffffffffffffffa8;
  
  L_00 = lj_lib_checkany(in_stack_ffffffffffffff80,(int)((ulong)in_stack_ffffffffffffff78 >> 0x20));
  pcVar1 = lj_meta_lookup(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,
                          in_stack_ffffffffffffff9c);
  if ((pcVar1->field_2).it == 0xffffffff) {
    if ((L_00->field_2).it != 0xfffffff4) {
      lj_err_argt((lua_State *)&L_00->field_2,(int)((ulong)pcVar1 >> 0x20),(int)pcVar1);
    }
    L_00[-1].field_2.field_0 =
         *(anon_union_4_2_de2f9c34_for_anon_struct_8_2_fd66bcdd_for_TValue_2_0 *)
          ((ulong)*(uint *)(*(long *)(in_RDI + 0x10) + -8) + 0x20);
    *(undefined4 *)((long)L_00 + -4) = 0xfffffff7;
    if (in_ESI == 0x14) {
      *(undefined4 *)((long)L_00 + 0xc) = 0xffffffff;
    }
    else {
      L_00[1].u64 = 0;
    }
    iVar2 = 4;
  }
  else {
    *(TValue **)(in_RDI + 0x18) = L_00 + 1;
    *(cTValue *)(*(long *)(in_RDI + 0x10) + -8) = *pcVar1;
    iVar2 = -1;
  }
  return iVar2;
}

Assistant:

static int ffh_pairs(lua_State *L, MMS mm)
{
  TValue *o = lj_lib_checkany(L, 1);
  cTValue *mo = lj_meta_lookup(L, o, mm);
  if ((LJ_52 || tviscdata(o)) && !tvisnil(mo)) {
    L->top = o+1;  /* Only keep one argument. */
    copyTV(L, L->base-1, mo);  /* Replace callable. */
    return FFH_TAILCALL;
  } else {
    if (!tvistab(o)) lj_err_argt(L, 1, LUA_TTABLE);
    setfuncV(L, o-1, funcV(lj_lib_upvalue(L, 1)));
    if (mm == MM_pairs) setnilV(o+1); else setintV(o+1, 0);
    return FFH_RES(3);
  }
}